

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  cmState *this_00;
  cmValue str;
  char *pcVar4;
  string_view str_00;
  string_view str_01;
  ostringstream e;
  string sStack_1b8;
  string local_198 [11];
  
  if (key == (char *)0x0) {
    pcVar4 = ExpandVariable(this,var);
    return pcVar4;
  }
  if (var == (char *)0x0) {
    return "";
  }
  iVar2 = strcmp(key,"ENV");
  if (iVar2 == 0) {
    local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
    local_198[0]._M_string_length = 0;
    local_198[0].field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::GetEnv(var,local_198);
    if (bVar1) {
      if (this->EscapeQuotes == true) {
        str_00._M_str = local_198[0]._M_dataplus._M_p;
        str_00._M_len = local_198[0]._M_string_length;
        cmEscapeQuotes_abi_cxx11_(&sStack_1b8,str_00);
        pcVar4 = AddString(this,&sStack_1b8);
        std::__cxx11::string::~string((string *)&sStack_1b8);
      }
      else {
        pcVar4 = AddString(this,local_198);
      }
    }
    else {
      pcVar4 = "";
    }
  }
  else {
    iVar2 = strcmp(key,"CACHE");
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      poVar3 = std::operator<<((ostream *)local_198,"Syntax $");
      poVar3 = std::operator<<(poVar3,key);
      poVar3 = std::operator<<(poVar3,"{} is not supported.  ");
      std::operator<<(poVar3,"Only ${}, $ENV{}, and $CACHE{} are allowed.");
      std::__cxx11::stringbuf::str();
      SetError(this,&sStack_1b8);
      std::__cxx11::string::~string((string *)&sStack_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      return (char *)0x0;
    }
    this_00 = cmMakefile::GetState(this->Makefile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,var,(allocator<char> *)&sStack_1b8);
    str = cmState::GetInitializedCacheValue(this_00,local_198);
    std::__cxx11::string::~string((string *)local_198);
    if (str.Value == (string *)0x0) {
      return "";
    }
    if (this->EscapeQuotes != true) {
      pcVar4 = AddString(this,str.Value);
      return pcVar4;
    }
    str_01._M_str = ((str.Value)->_M_dataplus)._M_p;
    str_01._M_len = (str.Value)->_M_string_length;
    cmEscapeQuotes_abi_cxx11_(local_198,str_01);
    pcVar4 = AddString(this,local_198);
  }
  std::__cxx11::string::~string((string *)local_198);
  return pcVar4;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandSpecialVariable(
  const char* key, const char* var)
{
  if (!key) {
    return this->ExpandVariable(var);
  }
  if (!var) {
    return "";
  }
  if (strcmp(key, "ENV") == 0) {
    std::string str;
    if (cmSystemTools::GetEnv(var, str)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmEscapeQuotes(str));
      }
      return this->AddString(str);
    }
    return "";
  }
  if (strcmp(key, "CACHE") == 0) {
    if (cmValue c =
          this->Makefile->GetState()->GetInitializedCacheValue(var)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmEscapeQuotes(*c));
      }
      return this->AddString(*c);
    }
    return "";
  }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return nullptr;
}